

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O3

void __thiscall
helics::BrokerBase::loadInfoFromToml(BrokerBase *this,string *tomlString,bool runArgParser)

{
  pointer __s;
  void *pvVar1;
  basic_value<toml::type_config> *v;
  shared_ptr<helics::helicsCLI11App> sVar2;
  shared_ptr<helics::helicsCLI11App> app;
  shared_ptr<helics::helicsCLI11App> sApp;
  ifstream file;
  value doc;
  undefined1 local_320 [16];
  App_p local_310;
  element_type *local_300;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2f8;
  undefined1 local_2f0 [72];
  undefined1 local_2a8 [104];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240 [14];
  basic_value<toml::type_config> local_e8;
  
  toml::basic_value<toml::type_config>::basic_value(&local_e8);
  fileops::loadToml((value *)local_2f0,(string *)tomlString);
  v = (basic_value<toml::type_config> *)local_2f0;
  toml::basic_value<toml::type_config>::operator=(&local_e8,v);
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_2f0,(EVP_PKEY_CTX *)v);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_240);
  toml::detail::region::~region((region *)local_2a8);
  if (!runArgParser) goto LAB_002e874c;
  sVar2 = generateBaseCLI((BrokerBase *)local_320);
  (*this->_vptr_BrokerBase[8])
            (&local_300,this,
             sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  local_310.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_300;
  local_310.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_2f8;
  if (local_2f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_2f8->_M_use_count = local_2f8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_2f8->_M_use_count = local_2f8->_M_use_count + 1;
    }
  }
  CLI::App::add_subcommand((App *)local_320._0_8_,&local_310);
  if (local_310.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_310.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  *(bool *)(local_320._0_8_ + 0x48) = true;
  CLI::App::get_config_formatter_base((App *)local_2f0);
  if (local_2f0._0_8_ != 0) {
    *(undefined1 *)(local_2f0._0_8_ + 0x50) = 1;
  }
  if (tomlString->_M_string_length == 0) {
LAB_002e8663:
    std::ifstream::ifstream(local_2f0,(string *)tomlString,_S_in);
    if (*(uint32_t *)(local_320._0_8_ + 0x2e4) == 0) {
      CLI::App::_validate((App *)local_320._0_8_);
      CLI::App::_configure((App *)local_320._0_8_);
    }
    CLI::App::_parse_stream((App *)local_320._0_8_,(istream *)local_2f0);
    v = (basic_value<toml::type_config> *)0x0;
    CLI::App::run_callback((App *)local_320._0_8_,false,false);
    std::ifstream::~ifstream(local_2f0);
  }
  else {
    __s = (tomlString->_M_dataplus)._M_p;
    pvVar1 = memchr(__s,0x3d,tomlString->_M_string_length);
    if ((long)pvVar1 - (long)__s == -1 || pvVar1 == (void *)0x0) goto LAB_002e8663;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_2f0,(string *)tomlString,_S_in);
    if (*(uint32_t *)(local_320._0_8_ + 0x2e4) == 0) {
      CLI::App::_validate((App *)local_320._0_8_);
      CLI::App::_configure((App *)local_320._0_8_);
    }
    CLI::App::_parse_stream((App *)local_320._0_8_,(istream *)local_2f0);
    CLI::App::run_callback((App *)local_320._0_8_,false,false);
    v = (basic_value<toml::type_config> *)&std::__cxx11::istringstream::VTT;
    std::__cxx11::istringstream::~istringstream((istringstream *)local_2f0);
    std::ios_base::~ios_base((ios_base *)(local_2a8 + 0x30));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._8_8_);
  }
  if (local_2f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2f8);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._8_8_);
  }
LAB_002e874c:
  toml::basic_value<toml::type_config>::cleanup(&local_e8,(EVP_PKEY_CTX *)v);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e8.comments_);
  toml::detail::region::~region(&local_e8.region_);
  return;
}

Assistant:

void BrokerBase::loadInfoFromToml(const std::string& tomlString, bool runArgParser)
{
    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& iarg) {
        throw(helics::InvalidParameter(iarg.what()));
    }

    if (runArgParser) {
        auto app = generateBaseCLI();
        auto sApp = generateCLI();
        app->add_subcommand(sApp);
        app->allow_extras();
        auto dptr = std::static_pointer_cast<HelicsConfigJSON>(app->get_config_formatter_base());
        if (dptr) {
            dptr->skipJson(true);
        }
        try {
            if (tomlString.find('=') != std::string::npos) {
                std::istringstream tstring(tomlString);
                app->parse_from_stream(tstring);
            } else {
                std::ifstream file(tomlString);
                app->parse_from_stream(file);
            }
        }
        catch (const CLI::Error& e) {
            throw(InvalidIdentifier(e.what()));
        }
    }
}